

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChQuaternion<double> *
chrono::Q_from_Vect_to_Vect
          (ChQuaternion<double> *__return_storage_ptr__,ChVector<double> *fr_vect,
          ChVector<double> *to_vect)

{
  double dVar1;
  byte bVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar25;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double length;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ulong local_50;
  undefined1 local_48 [16];
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  double local_18;
  undefined8 uStack_10;
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  dVar12 = fr_vect->m_data[1];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar12;
  dVar13 = to_vect->m_data[1];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar13;
  dVar14 = to_vect->m_data[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar14;
  dVar25 = fr_vect->m_data[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar25;
  dVar27 = fr_vect->m_data[2];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar27;
  dVar1 = to_vect->m_data[2];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1;
  auVar20 = vunpcklpd_avx(auVar36,auVar43);
  auVar15 = vunpcklpd_avx(auVar19,auVar38);
  auVar22 = vunpcklpd_avx(auVar44,auVar41);
  auVar28._0_8_ = auVar20._0_8_ * auVar20._0_8_;
  auVar28._8_8_ = auVar20._8_8_ * auVar20._8_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1 * dVar25;
  auVar16 = vfmsub231sd_fma(auVar17,auVar44,auVar38);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar27 * dVar13;
  auVar21 = vfmsub231sd_fma(auVar21,auVar36,auVar41);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar14 * dVar12;
  auVar17 = vfmsub231sd_fma(auVar49,auVar19,auVar43);
  auVar20 = vfmadd213pd_fma(auVar15,auVar15,auVar28);
  auVar20 = vfmadd231pd_fma(auVar20,auVar22,auVar22);
  auVar15 = vsqrtpd_avx(auVar20);
  auVar20 = vshufpd_avx(auVar15,auVar15,1);
  dVar26 = auVar15._0_8_ * auVar20._0_8_;
  dVar47 = auVar16._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar47 * dVar47;
  auVar20 = vfmadd231sd_fma(auVar20,auVar21,auVar21);
  auVar20 = vfmadd231sd_fma(auVar20,auVar17,auVar17);
  auVar20 = vsqrtsd_avx(auVar20,auVar20);
  auVar28 = ZEXT816(0xbff0000000000000);
  auVar53._0_8_ = auVar20._0_8_ / dVar26;
  auVar53._8_8_ = auVar20._8_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar26;
  auVar15 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar15);
  dVar26 = auVar15._0_8_;
  bVar5 = auVar53._0_8_ < -1.0;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar14 * dVar26;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar13 * dVar26 * dVar12;
  auVar15 = vfmadd231sd_fma(auVar57,auVar19,auVar55);
  auVar16._8_8_ = 0x7fffffffffffffff;
  auVar16._0_8_ = 0x7fffffffffffffff;
  auVar16 = vandpd_avx512vl(auVar53,auVar16);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1 * dVar26;
  auVar15 = vfmadd231sd_fma(auVar15,auVar44,auVar29);
  uVar4 = vcmpsd_avx512f(auVar15,auVar28,1);
  bVar10 = (bool)((byte)uVar4 & 1);
  auVar15 = vminsd_avx512f(ZEXT816(0x3ff0000000000000),auVar15);
  dVar12 = (double)((ulong)bVar10 * -0x4010000000000000 + (ulong)!bVar10 * auVar15._0_8_);
  uVar4 = vcmpsd_avx512f(ZEXT816(0x3ff0000000000000),auVar53,1);
  bVar10 = (bool)((byte)uVar4 & 1);
  dVar13 = (double)((ulong)bVar5 * 0x3ff0000000000000 +
                   (ulong)!bVar5 *
                   ((ulong)bVar10 * 0x3ff0000000000000 + (ulong)!bVar10 * auVar16._0_8_));
  if ((dVar13 != 0.0) || (dVar12 <= 0.0)) {
    auVar15 = ZEXT816(0x3ff0000000000000);
    if ((1e-06 <= dVar13) || (0.0 <= dVar12)) {
      auVar22 = vminsd_avx512f(auVar15,auVar53);
      auVar15 = vdivsd_avx512f(auVar15,auVar20);
      bVar10 = 2.2250738585072014e-308 <= auVar20._0_8_;
      dVar13 = auVar15._0_8_;
      local_38 = (double)((ulong)bVar10 * (long)(auVar21._0_8_ * dVar13) +
                         (ulong)!bVar10 * 0x3ff0000000000000);
      local_28 = (double)((ulong)bVar10 * (long)(dVar47 * dVar13));
      local_18 = (double)((ulong)bVar10 * (long)(auVar17._0_8_ * dVar13));
      uStack_30 = 0;
      uStack_20 = 0;
      uStack_10 = 0;
      dVar13 = ChAtan2(dVar12,(double)((ulong)bVar5 * -0x4010000000000000 +
                                      (ulong)!bVar5 * auVar22._0_8_));
      dVar12 = sin(dVar13 * 0.5);
      dVar13 = cos(dVar13 * 0.5);
      __return_storage_ptr__->m_data[0] = dVar13;
      __return_storage_ptr__->m_data[1] = dVar12 * local_38;
      __return_storage_ptr__->m_data[2] = dVar12 * local_28;
      dVar12 = dVar12 * local_18;
    }
    else {
      auVar50._8_8_ = 0x7fffffffffffffff;
      auVar50._0_8_ = 0x7fffffffffffffff;
      auVar16 = vunpcklpd_avx(auVar43,auVar36);
      auVar20 = vunpcklpd_avx(auVar38,auVar19);
      auVar21 = vunpcklpd_avx(auVar43,auVar41);
      auVar20 = vandpd_avx(auVar20,auVar50);
      auVar16 = vandpd_avx(auVar16,auVar50);
      auVar46._0_8_ = -dVar27;
      auVar46._8_8_ = 0x8000000000000000;
      auVar17 = vunpcklpd_avx(auVar41,auVar44);
      local_48._0_8_ = auVar21._0_8_ ^ 0x8000000000000000;
      local_48._8_8_ = auVar21._8_8_ ^ 0x8000000000000000;
      auVar30._0_8_ = -dVar25;
      auVar30._8_8_ = 0x8000000000000000;
      uVar11 = vcmppd_avx512vl(auVar20,auVar16,1);
      uVar11 = uVar11 & 3;
      auVar16 = vandpd_avx(auVar17,auVar50);
      auVar45._0_8_ = -dVar14;
      auVar45._8_8_ = 0x8000000000000000;
      local_50 = vmovlpd_avx(auVar45);
      auVar21 = vunpcklpd_avx(auVar19,auVar45);
      uVar7 = uVar11 >> 1;
      auVar17 = vunpcklpd_avx512vl(local_48,auVar36);
      bVar10 = (bool)((byte)uVar11 & 1);
      auVar18._0_8_ = (ulong)bVar10 * auVar17._0_8_ | (ulong)!bVar10 * auVar20._0_8_;
      auVar18._8_8_ = (uVar11 >> 1) * auVar17._8_8_ | (ulong)!SUB81(uVar11 >> 1,0) * auVar20._8_8_;
      uVar3 = vcmppd_avx512vl(auVar18,auVar16,5);
      bVar10 = (uVar3 & 2) == 0;
      uVar8 = (int)uVar7 + 1;
      if (bVar10) {
        uVar8 = 0;
      }
      if (bVar10) {
        uVar7 = 2;
      }
      dVar12 = fr_vect->m_data[uVar8];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar12;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = fr_vect->m_data[uVar7];
      uVar7 = (ulong)(uVar8 + 1);
      if (uVar8 + 1 == 3) {
        uVar7 = 0;
      }
      uVar8 = (uint)uVar11 & 1;
      bVar10 = (uVar3 & 1) == 0;
      uVar11 = (ulong)(uVar8 + 1);
      if (bVar10) {
        uVar8 = 2;
      }
      auVar56._8_8_ = 0;
      auVar56._0_8_ = fr_vect->m_data[uVar7];
      __return_storage_ptr__->m_data[0] = 0.0;
      if (bVar10) {
        uVar11 = 0;
      }
      uVar9 = (int)uVar11 + 1;
      if (uVar9 == 3) {
        uVar9 = 0;
      }
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(ulong *)(local_48 + (ulong)uVar9 * 8 + -8);
      auVar51._0_8_ = -dVar12;
      auVar51._8_8_ = 0x8000000000000000;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(local_48 + (ulong)uVar8 * 8 + -8);
      auVar20 = vunpcklpd_avx(auVar52,auVar41);
      auVar16 = vunpcklpd_avx(auVar56,auVar38);
      auVar17 = vunpcklpd_avx(auVar30,auVar58);
      auVar29 = vunpcklpd_avx(auVar46,auVar54);
      auVar19 = vunpcklpd_avx512vl(auVar56,auVar58);
      auVar31._0_8_ = auVar16._0_8_ * auVar17._0_8_;
      auVar31._8_8_ = auVar16._8_8_ * auVar17._8_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)(local_48 + uVar11 * 8 + -8);
      auVar42._0_8_ = auVar29._0_8_ * auVar20._0_8_;
      auVar42._8_8_ = auVar29._8_8_ * auVar20._8_8_;
      auVar20 = vunpcklpd_avx(auVar36,local_48);
      auVar17 = vfmadd213pd_avx512vl(auVar19,auVar20,auVar42);
      auVar20 = vunpcklpd_avx(auVar51,auVar39);
      auVar16 = vfmadd213pd_fma(auVar20,auVar22,auVar31);
      auVar20 = vunpcklpd_avx(auVar36,auVar39);
      auVar22 = vunpcklpd_avx(auVar48,local_48);
      auVar32._0_8_ = auVar20._0_8_ * auVar22._0_8_;
      auVar32._8_8_ = auVar20._8_8_ * auVar22._8_8_;
      auVar20 = vunpcklpd_avx(auVar52,auVar54);
      auVar22 = vfmadd213pd_fma(auVar20,auVar21,auVar32);
      auVar33._0_8_ = auVar16._0_8_ * auVar16._0_8_;
      auVar33._8_8_ = auVar16._8_8_ * auVar16._8_8_;
      auVar34._8_8_ = 0x3ff0000000000000;
      auVar34._0_8_ = 0x3ff0000000000000;
      auVar20 = vfmadd231pd_avx512vl(auVar33,auVar17,auVar17);
      auVar20 = vfmadd231pd_fma(auVar20,auVar22,auVar22);
      auVar20 = vsqrtpd_avx(auVar20);
      auVar6._8_8_ = 0x10000000000000;
      auVar6._0_8_ = 0x10000000000000;
      uVar11 = vcmppd_avx512vl(auVar20,auVar6,5);
      uVar11 = uVar11 & 3;
      auVar20 = vdivpd_avx(auVar34,auVar20);
      auVar16 = vmulpd_avx512vl(auVar16,auVar20);
      bVar2 = (byte)uVar11;
      auVar21 = vmulpd_avx512vl(auVar17,auVar20);
      dVar14 = (double)((ulong)(bVar2 & 1) * auVar21._0_8_ |
                       (ulong)!(bool)(bVar2 & 1) * 0x3ff0000000000000);
      dVar25 = (double)((uVar11 >> 1) * auVar21._8_8_ |
                       (ulong)!SUB81(uVar11 >> 1,0) * 0x3ff0000000000000);
      auVar20 = vmulpd_avx512vl(auVar22,auVar20);
      dVar12 = (double)((ulong)(bVar2 & 1) * auVar20._0_8_);
      dVar13 = (double)((uVar11 >> 1) * auVar20._8_8_);
      dVar27 = (double)((ulong)(bVar2 & 1) * auVar16._0_8_) +
               (double)((uVar11 >> 1) * auVar16._8_8_);
      auVar35._0_8_ = dVar14 + dVar25;
      auVar35._8_8_ = dVar14 + dVar25;
      auVar37._0_8_ = dVar12 + dVar13;
      auVar37._8_8_ = dVar12 + dVar13;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar27 * dVar27;
      auVar20 = vfmadd231sd_fma(auVar40,auVar35,auVar35);
      auVar20 = vfmadd231sd_fma(auVar20,auVar37,auVar37);
      auVar20 = vsqrtsd_avx(auVar20,auVar20);
      auVar22 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar20);
      bVar10 = 2.2250738585072014e-308 <= auVar20._0_8_;
      dVar12 = auVar22._0_8_;
      auVar22._0_8_ =
           (ulong)bVar10 * (long)(auVar35._0_8_ * dVar12) + (ulong)!bVar10 * 0x3ff0000000000000;
      auVar22._8_8_ = 0;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = (ulong)bVar10 * (long)(dVar27 * dVar12);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = (ulong)bVar10 * (long)(auVar37._0_8_ * dVar12);
      uVar4 = vcmpsd_avx512f(auVar22,auVar28,1);
      bVar10 = (bool)((byte)uVar4 & 1);
      auVar20 = vminsd_avx512f(auVar15,auVar22);
      uVar4 = vcmpsd_avx512f(auVar23,auVar28,1);
      bVar5 = (bool)((byte)uVar4 & 1);
      __return_storage_ptr__->m_data[1] =
           (double)((ulong)bVar10 * -0x4010000000000000 + (ulong)!bVar10 * auVar20._0_8_);
      auVar20 = vminsd_avx512f(auVar15,auVar23);
      uVar4 = vcmpsd_avx512f(auVar24,auVar28,1);
      bVar10 = (bool)((byte)uVar4 & 1);
      auVar15 = vminsd_avx512f(auVar15,auVar24);
      __return_storage_ptr__->m_data[2] =
           (double)((ulong)bVar5 * -0x4010000000000000 + (ulong)!bVar5 * auVar20._0_8_);
      dVar12 = (double)((ulong)bVar10 * -0x4010000000000000 + (ulong)!bVar10 * auVar15._0_8_);
    }
    __return_storage_ptr__->m_data[3] = dVar12;
  }
  else {
    __return_storage_ptr__->m_data[0] = 1.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[3] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Q_from_Vect_to_Vect(const ChVector<double>& fr_vect, const ChVector<double>& to_vect) {
    const double ANGLE_TOLERANCE = 1e-6;
    ChQuaternion<double> quat;
    double halfang;
    double sinhalf;
    ChVector<double> axis;

    double lenXlen = fr_vect.Length() * to_vect.Length();
    axis = fr_vect % to_vect;
    double sinangle = ChClamp(axis.Length() / lenXlen, -1.0, +1.0);
    double cosangle = ChClamp(fr_vect ^ to_vect / lenXlen, -1.0, +1.0);

    // Consider three cases: Parallel, Opposite, non-collinear
    if (std::abs(sinangle) == 0.0 && cosangle > 0) {
        // fr_vect & to_vect are parallel
        quat.e0() = 1.0;
        quat.e1() = 0.0;
        quat.e2() = 0.0;
        quat.e3() = 0.0;
    } else if (std::abs(sinangle) < ANGLE_TOLERANCE && cosangle < 0) {
        // fr_vect & to_vect are opposite, i.e. ~180 deg apart
        axis = fr_vect.GetOrthogonalVector() + (-to_vect).GetOrthogonalVector();
        axis.Normalize();
        quat.e0() = 0.0;
        quat.e1() = ChClamp(axis.x(), -1.0, +1.0);
        quat.e2() = ChClamp(axis.y(), -1.0, +1.0);
        quat.e3() = ChClamp(axis.z(), -1.0, +1.0);
    } else {
        // fr_vect & to_vect are not co-linear case
        axis.Normalize();
        halfang = 0.5 * ChAtan2(cosangle, sinangle);
        sinhalf = sin(halfang);

        quat.e0() = cos(halfang);
        quat.e1() = sinhalf* axis.x();
        quat.e2() = sinhalf* axis.y();
        quat.e3() = sinhalf* axis.z();
    }
    return (quat);
}